

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_ssse3.c
# Opt level: O0

void calculate_qcoeff_64x64(__m128i *coeff,__m128i round,__m128i quant,__m128i *shift)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  ulong local_178;
  ulong uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  __m128i tmp1;
  __m128i qcoeff;
  __m128i tmp;
  __m128i *shift_local;
  __m128i quant_local;
  __m128i round_local;
  __m128i *coeff_local;
  
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4 = paddsw((undefined1  [16])*coeff,auVar4);
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = in_XMM1_Qa;
  auVar5 = pmulhw(auVar4,auVar3);
  local_f8 = auVar5._0_2_;
  sStack_f6 = auVar5._2_2_;
  sStack_f4 = auVar5._4_2_;
  sStack_f2 = auVar5._6_2_;
  sStack_f0 = auVar5._8_2_;
  sStack_ee = auVar5._10_2_;
  sStack_ec = auVar5._12_2_;
  sStack_ea = auVar5._14_2_;
  local_108 = auVar4._0_2_;
  sStack_106 = auVar4._2_2_;
  sStack_104 = auVar4._4_2_;
  sStack_102 = auVar4._6_2_;
  sStack_100 = auVar4._8_2_;
  sStack_fe = auVar4._10_2_;
  sStack_fc = auVar4._12_2_;
  sStack_fa = auVar4._14_2_;
  local_168._0_4_ = CONCAT22(sStack_f6 + sStack_106,local_f8 + local_108);
  local_168._0_6_ = CONCAT24(sStack_f4 + sStack_104,(undefined4)local_168);
  local_168 = CONCAT26(sStack_f2 + sStack_102,(undefined6)local_168);
  uStack_160._0_2_ = sStack_f0 + sStack_100;
  uStack_160._2_2_ = sStack_ee + sStack_fe;
  uStack_160._4_2_ = sStack_ec + sStack_fc;
  uStack_160._6_2_ = sStack_ea + sStack_fa;
  uVar1 = *(undefined8 *)round[0];
  uVar2 = *(undefined8 *)(round[0] + 8);
  shift_local._0_2_ = (short)uVar1;
  shift_local._2_2_ = (short)((ulong)uVar1 >> 0x10);
  shift_local._4_2_ = (short)((ulong)uVar1 >> 0x20);
  shift_local._6_2_ = (short)((ulong)uVar1 >> 0x30);
  quant_local[0]._0_2_ = (short)uVar2;
  quant_local[0]._2_2_ = (short)((ulong)uVar2 >> 0x10);
  quant_local[0]._4_2_ = (short)((ulong)uVar2 >> 0x20);
  quant_local[0]._6_2_ = (short)((ulong)uVar2 >> 0x30);
  local_158._0_4_ =
       CONCAT22((ushort)((sStack_f6 + sStack_106) * shift_local._2_2_) >> 0xe,
                (ushort)((local_f8 + local_108) * (short)shift_local) >> 0xe);
  local_158._0_6_ =
       CONCAT24((ushort)((sStack_f4 + sStack_104) * shift_local._4_2_) >> 0xe,(undefined4)local_158)
  ;
  local_158 = CONCAT26((ushort)((sStack_f2 + sStack_102) * shift_local._6_2_) >> 0xe,
                       (undefined6)local_158);
  uStack_150._0_2_ = (ushort)((sStack_f0 + sStack_100) * (short)quant_local[0]) >> 0xe;
  uStack_150._2_2_ = (ushort)((sStack_ee + sStack_fe) * quant_local[0]._2_2_) >> 0xe;
  uStack_150._4_2_ = (ushort)((sStack_ec + sStack_fc) * quant_local[0]._4_2_) >> 0xe;
  uStack_150._6_2_ = (ushort)((sStack_ea + sStack_fa) * quant_local[0]._6_2_) >> 0xe;
  auVar5._8_8_ = uStack_160;
  auVar5._0_8_ = local_168;
  auVar4 = pmulhw(auVar5,*(undefined1 (*) [16])round[0]);
  auVar4 = psllw(auVar4,ZEXT416(2));
  local_178 = auVar4._0_8_;
  uStack_170 = auVar4._8_8_;
  (*coeff)[0] = local_158 | local_178;
  (*coeff)[1] = uStack_150 | uStack_170;
  return;
}

Assistant:

static inline void calculate_qcoeff_64x64(__m128i *coeff, const __m128i round,
                                          const __m128i quant,
                                          const __m128i *shift) {
  __m128i tmp, qcoeff, tmp1;
  qcoeff = _mm_adds_epi16(*coeff, round);
  tmp = _mm_mulhi_epi16(qcoeff, quant);
  qcoeff = _mm_add_epi16(tmp, qcoeff);
  tmp = _mm_mullo_epi16(qcoeff, *shift);
  tmp = _mm_srli_epi16(tmp, 14);
  tmp1 = _mm_mulhi_epi16(qcoeff, *shift);
  tmp1 = _mm_slli_epi16(tmp1, 2);
  *coeff = _mm_or_si128(tmp, tmp1);
}